

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QASMFile.hpp
# Opt level: O0

int __thiscall
qclab::io::QASMFile::
parse1a<qclab::qgates::Phase<std::complex<float>>,qclab::QObject<std::complex<float>>>
          (QASMFile *this,string *name,string *command,
          unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
          *gate)

{
  __type _Var1;
  string *psVar2;
  unique_ptr<qclab::qgates::Phase<std::complex<float>_>,_std::default_delete<qclab::qgates::Phase<std::complex<float>_>_>_>
  local_a0;
  float local_94;
  float local_90;
  int qubit;
  float angle;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined8 local_40;
  size_type n2;
  size_type n1;
  unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
  *gate_local;
  string *command_local;
  string *name_local;
  QASMFile *this_local;
  
  n1 = (size_type)gate;
  gate_local = (unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
                *)command;
  command_local = name;
  name_local = (string *)this;
  n2 = std::__cxx11::string::length();
  local_40 = std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)&local_60,(ulong)gate_local);
  std::operator+(&local_80,name,"(");
  _Var1 = std::operator==(&local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  if (_Var1) {
    psVar2 = (string *)std::__cxx11::string::erase((ulong)gate_local,0);
    local_90 = parseAngle<float>(this,psVar2);
    psVar2 = (string *)std::__cxx11::string::erase((ulong)gate_local,0);
    local_94 = (float)parseQubit(this,psVar2);
    std::make_unique<qclab::qgates::Phase<std::complex<float>>,int_const&,float_const&>
              ((int *)&local_a0,&local_94);
    std::
    unique_ptr<qclab::QObject<std::complex<float>>,std::default_delete<qclab::QObject<std::complex<float>>>>
    ::operator=((unique_ptr<qclab::QObject<std::complex<float>>,std::default_delete<qclab::QObject<std::complex<float>>>>
                 *)n1,&local_a0);
    std::
    unique_ptr<qclab::qgates::Phase<std::complex<float>_>,_std::default_delete<qclab::qgates::Phase<std::complex<float>_>_>_>
    ::~unique_ptr(&local_a0);
  }
  this_local._4_4_ = (uint)_Var1;
  return this_local._4_4_;
}

Assistant:

int parse1a( std::string name , std::string& command ,
                   std::unique_ptr< GATE >& gate ) const {
        using T = typename G::value_type ;
        using R = qclab::real_t< T > ;
        const auto n1 = name.length() ;
        const auto n2 = qregName_.length() ;
        if ( command.substr( 0 , n1 + 1 ) == name + "(" ) {
          const auto angle = parseAngle< R >( command.erase( 0 , n1 + 1 ) ) ;
          const auto qubit = parseQubit(      command.erase( 0 , n2 + 1 ) ) ;
          gate = std::make_unique< G >( qubit , angle ) ;
          return 1 ;
        }
        return 0 ;
      }